

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteLinearConExpr
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *this)

{
  uint i;
  SingleSparseDblVecWrtFactory vwf;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  SingleSparseVecWrtFactory<int,_double> local_68;
  
  for (i = 0; (int)i < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
      i = i + 1) {
    local_88._4_4_ = 0;
    local_88._0_4_ = i;
    local_70 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/mp/nl-writer2.hpp:592:13)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/mp/nl-writer2.hpp:592:13)>
               ::_M_manager;
    local_88._8_8_ = this;
    SingleSparseVecWrtFactory<int,_double>::SingleSparseVecWrtFactory
              (&local_68,this,(function<void_(int)> *)&local_88);
    std::_Function_base::~_Function_base((_Function_base *)&local_88);
    NLFeeder_Easy::
    FeedLinearConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
              (this->feeder_,i,&local_68);
    std::_Function_base::~_Function_base(&local_68.hdr_prn_.super__Function_base);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteLinearConExpr() {
  for (int i=0; i<Hdr().num_algebraic_cons; ++i) {
    SingleSparseDblVecWrtFactory
        vwf(*this,
            [i, this](int nnz){
      this->apr(this->nm, "J%d %d\n", i, nnz);
    });
    Feeder().FeedLinearConExpr(i, vwf);
  }
}